

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

bool __thiscall acto::actor_ref::send<msg_loop>(actor_ref *this,msg_loop *msg)

{
  unique_ptr<acto::core::msg_wrap_t<msg_loop>,_std::default_delete<acto::core::msg_wrap_t<msg_loop>_>_>
  local_30;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_28;
  msg_loop *local_20;
  msg_loop *msg_local;
  actor_ref *this_local;
  
  if (this->object_ == (object_t *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_20 = msg;
    msg_local = (msg_loop *)this;
    std::make_unique<acto::core::msg_wrap_t<msg_loop>,msg_loop>((msg_loop *)&local_30);
    std::unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>>::
    unique_ptr<acto::core::msg_wrap_t<msg_loop>,std::default_delete<acto::core::msg_wrap_t<msg_loop>>,void>
              ((unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>> *)&local_28,
               &local_30);
    this_local._7_1_ = send_message(this,&local_28);
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
              (&local_28);
    std::
    unique_ptr<acto::core::msg_wrap_t<msg_loop>,_std::default_delete<acto::core::msg_wrap_t<msg_loop>_>_>
    ::~unique_ptr(&local_30);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool send(Msg&& msg) const {
    if (!object_) {
      return false;
    }

    return send_message(
      std::make_unique<core::msg_wrap_t<std::remove_cvref_t<Msg>>>(
        std::forward<Msg>(msg)));
  }